

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS580314BA.cpp
# Opt level: O2

void * MS580314BAThread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double pressure;
  int local_8f0;
  int local_8ec;
  double local_8e8;
  undefined8 uStack_8e0;
  timeval local_8d8;
  double local_8c0;
  double local_8b8;
  interval local_8b0;
  interval local_898;
  CHRONO chrono_filter;
  interval local_838;
  CHRONO chrono_period;
  char szTemp [256];
  MS580314BA ms580314ba;
  char szSaveFilePath [256];
  
  pressure = 0.0;
  memset(&ms580314ba,0,0x598);
  StartChrono(&chrono_filter);
  StartChrono(&chrono_period);
  local_8e8 = 0.0;
  uStack_8e0 = 0;
  bVar2 = false;
  local_8f0 = 0;
  iVar9 = 100;
LAB_001834c1:
  local_8ec = iVar9;
  lVar8 = (long)local_8ec;
  bVar2 = !bVar2;
  while( true ) {
    StopChronoQuick(&chrono_period);
    StartChrono(&chrono_period);
    mSleep(lVar8);
    iVar9 = local_8ec;
    if (bPauseMS580314BA == 0) break;
    if (!bVar2) {
      puts("MS580314BA Paused.");
      DisconnectMS580314BA(&ms580314ba);
    }
    if (bExit != 0) goto LAB_001838e6;
    mSleep(100);
    bVar2 = true;
  }
  if (bRestartMS580314BA == 0) {
    if (bVar2) goto LAB_0018357a;
    iVar7 = GetPressureMS580314BA(&ms580314ba,&pressure);
    if (iVar7 != 0) {
      puts("Connection to a MS580314BA lost.");
      DisconnectMS580314BA(&ms580314ba);
      goto LAB_00183597;
    }
    iVar7 = gettimeofday(&local_8d8,(__timezone_ptr_t)0x0);
    if (iVar7 != 0) {
      local_8d8.tv_sec = 0;
      local_8d8.tv_usec = 0;
    }
    pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
    pressure_mes = pressure;
    dVar11 = GetTimeElapsedChronoQuick(&chrono_filter);
    if ((2.0 < dVar11) && (dVar11 = GetTimeElapsedChronoQuick(&chrono_filter), dVar11 <= 3.0)) {
      local_8e8 = pressure;
      uStack_8e0 = 0;
    }
    dVar12 = GetTimeElapsedChronoQuick(&chrono_filter);
    dVar11 = pressure;
    if (3.0 < dVar12) {
      uVar10 = -(ulong)(ABS(pressure - local_8e8) < 0.05);
      dVar11 = (double)((ulong)pressure & uVar10 | ~uVar10 & (ulong)local_8e8);
      local_8e8 = dVar11;
    }
    local_8b8 = ((dVar11 - ms580314ba.PressureRef) * -100000.0) /
                (ms580314ba.WaterDensity * 9.80665);
    interval::interval(&local_898,&local_8b8);
    local_8c0 = -z_pressure_acc;
    interval::interval(&local_8b0,&local_8c0,&z_pressure_acc);
    operator+(&local_898,&local_8b0);
    interval::operator=((interval *)&z_pressure,&local_838);
    pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
    if (ms580314ba.bSaveRawData != 0) {
      fprintf((FILE *)ms580314ba.pfSaveFile,"%d;%d;%f;\n",pressure,local_8d8.tv_sec & 0xffffffff,
              local_8d8.tv_usec & 0xffffffff);
      goto LAB_0018373e;
    }
  }
  else {
    if (!bVar2) {
      puts("Restarting a MS580314BA.");
      DisconnectMS580314BA(&ms580314ba);
    }
    bRestartMS580314BA = 0;
LAB_0018357a:
    iVar7 = local_8ec;
    iVar4 = ConnectMS580314BA(&ms580314ba,"MS580314BA0.txt");
    iVar9 = ms580314ba.threadperiod;
    if (iVar4 != 0) {
      mSleep(1000);
      iVar9 = iVar7;
LAB_00183597:
      if (ExitOnErrorCount <= local_8f0 + 1 && 0 < ExitOnErrorCount) {
        bExit = 1;
LAB_001838e6:
        bVar3 = true;
        goto LAB_001838e8;
      }
      bVar2 = false;
      bVar3 = true;
      local_8f0 = local_8f0 + 1;
      goto LAB_00183750;
    }
    StopChronoQuick(&chrono_filter);
    StartChrono(&chrono_filter);
    if (ms580314ba.pfSaveFile != (FILE *)0x0) {
      fclose((FILE *)ms580314ba.pfSaveFile);
      ms580314ba.pfSaveFile = (FILE *)0x0;
    }
    if (ms580314ba.bSaveRawData == 0) goto LAB_0018374b;
    if (ms580314ba.szCfgFilePath[0] == '\0') {
      builtin_strncpy(szTemp,"ms580314ba",0xb);
    }
    else {
      sprintf(szTemp,"%.127s",ms580314ba.szCfgFilePath);
    }
    sVar5 = strlen(szTemp);
    iVar7 = (int)sVar5 + 1;
    uVar10 = sVar5 & 0xffffffff;
    do {
      if ((int)uVar10 < 1) goto LAB_001836c8;
      uVar1 = uVar10 - 1;
      iVar7 = iVar7 + -1;
      lVar8 = uVar10 - 1;
      uVar10 = uVar1;
    } while (szTemp[lVar8] != '.');
    if ((uVar1 != 0) && (iVar7 <= (int)sVar5)) {
      memset(szTemp + (uVar1 & 0xffffffff),0,sVar5 - (uVar1 & 0xffffffff));
    }
LAB_001836c8:
    pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
    pcVar6 = strtimeex_fns();
    sprintf(szSaveFilePath,"log/%.127s_%.64s.csv",szTemp,pcVar6);
    pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
    ms580314ba.pfSaveFile = (FILE *)fopen(szSaveFilePath,"w");
    if ((FILE *)ms580314ba.pfSaveFile == (FILE *)0x0) {
      puts("Unable to create MS580314BA data file.");
      bVar3 = false;
      goto LAB_001838e8;
    }
    fwrite("tv_sec;tv_usec;pressure;\n",0x19,1,(FILE *)ms580314ba.pfSaveFile);
LAB_0018373e:
    fflush((FILE *)ms580314ba.pfSaveFile);
  }
LAB_0018374b:
  bVar3 = false;
  bVar2 = true;
LAB_00183750:
  if (bExit != 0) {
LAB_001838e8:
    StopChronoQuick(&chrono_period);
    StopChronoQuick(&chrono_filter);
    if (ms580314ba.pfSaveFile != (FILE *)0x0) {
      fclose((FILE *)ms580314ba.pfSaveFile);
      ms580314ba.pfSaveFile = (FILE *)0x0;
    }
    if (!bVar3) {
      DisconnectMS580314BA(&ms580314ba);
    }
    if (bExit == 0) {
      bExit = 1;
    }
    return (void *)0x0;
  }
  goto LAB_001834c1;
}

Assistant:

THREAD_PROC_RETURN_VALUE MS580314BAThread(void* pParam)
{
	MS580314BA ms580314ba;
	struct timeval tv;
	double pressure = 0, pressure_prev = 0, filteredpressure = 0;
	CHRONO chrono_filter;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&ms580314ba, 0, sizeof(MS580314BA));

	StartChrono(&chrono_filter);

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseMS580314BA)
		{
			if (bConnected)
			{
				printf("MS580314BA Paused.\n");
				bConnected = FALSE;
				DisconnectMS580314BA(&ms580314ba);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartMS580314BA)
		{
			if (bConnected)
			{
				printf("Restarting a MS580314BA.\n");
				bConnected = FALSE;
				DisconnectMS580314BA(&ms580314ba);
			}
			bRestartMS580314BA = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectMS580314BA(&ms580314ba, "MS580314BA0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = ms580314ba.threadperiod;

				StopChronoQuick(&chrono_filter);
				StartChrono(&chrono_filter);

				if (ms580314ba.pfSaveFile != NULL)
				{
					fclose(ms580314ba.pfSaveFile); 
					ms580314ba.pfSaveFile = NULL;
				}
				if ((ms580314ba.bSaveRawData)&&(ms580314ba.pfSaveFile == NULL)) 
				{
					if (strlen(ms580314ba.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", ms580314ba.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "ms580314ba");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					ms580314ba.pfSaveFile = fopen(szSaveFilePath, "w");
					if (ms580314ba.pfSaveFile == NULL) 
					{
						printf("Unable to create MS580314BA data file.\n");
						break;
					}
					fprintf(ms580314ba.pfSaveFile, "tv_sec;tv_usec;pressure;\n"); 
					fflush(ms580314ba.pfSaveFile);
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetPressureMS580314BA(&ms580314ba, &pressure) == EXIT_SUCCESS)
			{
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				EnterCriticalSection(&StateVariablesCS);
				pressure_mes = pressure;
				if ((GetTimeElapsedChronoQuick(&chrono_filter) > 2)&&(GetTimeElapsedChronoQuick(&chrono_filter) <= 3))
				{
					pressure_prev = pressure; // Initialization of pressure_prev...
				}
				if (GetTimeElapsedChronoQuick(&chrono_filter) > 3)
				{
					if (fabs(pressure-pressure_prev) < 0.05)
					{
						filteredpressure = pressure;
						pressure_prev = filteredpressure;
					}
					else
					{
						// Ignore outlier...
						filteredpressure = pressure_prev;
					}
				}
				else
				{
					filteredpressure = pressure;
				}
				z_pressure = Pressure2Height(filteredpressure, ms580314ba.PressureRef, ms580314ba.WaterDensity)+interval(-z_pressure_acc, z_pressure_acc);
				LeaveCriticalSection(&StateVariablesCS);

				if (ms580314ba.bSaveRawData)
				{
					fprintf(ms580314ba.pfSaveFile, "%d;%d;%f;\n", (int)tv.tv_sec, (int)tv.tv_usec, pressure);
					fflush(ms580314ba.pfSaveFile);
				}
			}
			else
			{
				printf("Connection to a MS580314BA lost.\n");
				bConnected = FALSE;
				DisconnectMS580314BA(&ms580314ba);
			}		
		}

		//printf("MS580314BAThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	StopChronoQuick(&chrono_filter);

	if (ms580314ba.pfSaveFile != NULL)
	{
		fclose(ms580314ba.pfSaveFile); 
		ms580314ba.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectMS580314BA(&ms580314ba);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}